

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWeakReference.h
# Opt level: O1

void __thiscall
Memory::WeakReferenceHashTable<PrimePolicy>::WeakReferenceHashTable
          (WeakReferenceHashTable<PrimePolicy> *this,uint size,HeapAllocator *allocator)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  HeapAllocator *this_00;
  undefined4 *puVar6;
  RecyclerWeakReferenceBase **__s;
  size_t byteSize;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  this->allocator = allocator;
  this->count = 0;
  this->size = 0;
  this->freeList = (RecyclerWeakReferenceBase *)0x0;
  this->modFunctionIndex = 0x4b;
  uVar4 = PrimePolicy::GetPrime(size,&this->modFunctionIndex);
  this->size = uVar4;
  data.plusSize = (size_t)uVar4;
  local_50 = (undefined1  [8])&RecyclerWeakReferenceBase*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_190d19;
  data.filename._0_4_ = 0x7f;
  this_00 = HeapAllocator::TrackAllocInfo(allocator,(TrackAllocData *)local_50);
  uVar1 = this->size;
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00723e46;
    *puVar6 = 0;
  }
  byteSize = (ulong)uVar1 << 3;
  __s = (RecyclerWeakReferenceBase **)HeapAllocator::AllocT<false>(this_00,byteSize);
  memset(__s,0,byteSize);
  if (__s == (RecyclerWeakReferenceBase **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_00723e46:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  this->buckets = __s;
  return;
}

Assistant:

WeakReferenceHashTable(uint size, HeapAllocator* allocator):
        count(0),
        size(0),
        modFunctionIndex(UNKNOWN_MOD_INDEX),
        allocator(allocator),
        freeList(nullptr)
    {
        this->size = SizePolicy::GetSize(size, &modFunctionIndex);
        buckets = AllocatorNewArrayZ(HeapAllocator, allocator, RecyclerWeakReferenceBase*, this->size);
    }